

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O3

int anon_unknown.dwarf_25bab::ChannelOut_localcontrol(lua_State *L)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  char local_1b [3];
  
  plVar3 = (long *)luaL_checkudata(L,1,"luartmidi.channelout");
  lVar1 = plVar3[1];
  iVar2 = lua_toboolean(L,2);
  local_1b[0] = (char)lVar1 + -0x50;
  local_1b[1] = 0x7a;
  local_1b[2] = 0x7f;
  if (iVar2 == 0) {
    local_1b[2] = 0;
  }
  (**(code **)(**(long **)(*plVar3 + 8) + 0x58))(*(long **)(*plVar3 + 8),local_1b,3);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_localcontrol(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	self.send(0xB0 + self.index, 0x7A, lua_toboolean(L, 2) ? 0x7F : 0x00);
	lua_settop(L, 1);
	return 1;
}